

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O1

void pop_sorted_suite::pop_alternating(void)

{
  int iVar1;
  undefined4 uVar2;
  long lVar3;
  int __tmp;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  array<int,_4UL> storage;
  array<int,_4UL> expect;
  int local_38 [2];
  
  storage._M_elems[0] = 0xb;
  storage._M_elems[1] = 0x16;
  storage._M_elems[2] = 0x21;
  storage._M_elems[3] = 0x2c;
  lVar4 = 4;
  lVar3 = 0;
  do {
    lVar7 = lVar4 >> 1;
    if (*(int *)((long)storage._M_elems + lVar7 * 4 + lVar3) < 0xb) {
      lVar8 = lVar7 * 4;
    }
    else {
      lVar8 = 0;
    }
    lVar3 = lVar3 + lVar8;
    lVar4 = lVar4 - lVar7;
  } while (1 < lVar4);
  iVar1 = *(int *)((long)storage._M_elems + lVar3);
  lVar4 = lVar3 + (ulong)(iVar1 < 0xb) * 4;
  if ((lVar4 != 0xc) && (lVar4 != 0x10)) {
    uVar2 = *(undefined4 *)((long)storage._M_elems + lVar3 + (ulong)(iVar1 < 0xb) * 4);
    do {
      *(undefined4 *)((long)storage._M_elems + lVar4) =
           *(undefined4 *)((long)storage._M_elems + lVar4 + 4);
      *(undefined4 *)((long)storage._M_elems + lVar4 + 4) = uVar2;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0xc);
  }
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0x2c;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x565,"void pop_sorted_suite::pop_alternating()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  lVar4 = 3;
  lVar3 = 0;
  do {
    lVar7 = lVar4 >> 1;
    if (*(int *)((long)storage._M_elems + lVar7 * 4 + lVar3) < 0x2c) {
      lVar8 = lVar7 * 4;
    }
    else {
      lVar8 = 0;
    }
    lVar3 = lVar3 + lVar8;
    lVar4 = lVar4 - lVar7;
  } while (1 < lVar4);
  iVar1 = *(int *)((long)storage._M_elems + lVar3);
  uVar5 = lVar3 + (ulong)(iVar1 < 0x2c) * 4;
  if ((uVar5 | 4) != 0xc) {
    uVar2 = *(undefined4 *)((long)storage._M_elems + lVar3 + (ulong)(iVar1 < 0x2c) * 4);
    do {
      *(undefined4 *)((long)storage._M_elems + uVar5) =
           *(undefined4 *)((long)storage._M_elems + uVar5 + 4);
      *(undefined4 *)((long)storage._M_elems + uVar5 + 4) = uVar2;
      uVar5 = uVar5 + 4;
    } while (uVar5 != 8);
  }
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0x2c;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x56d,"void pop_sorted_suite::pop_alternating()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  uVar5 = (ulong)(storage._M_elems[1] < 0x16);
  uVar6 = (ulong)(storage._M_elems[uVar5] < 0x16);
  lVar3 = uVar5 * 4 + uVar6 * 4;
  if ((lVar3 != 4) && ((int)lVar3 != 8)) {
    iVar1 = storage._M_elems[uVar6 + uVar5];
    do {
      *(undefined4 *)((long)storage._M_elems + lVar3) =
           *(undefined4 *)((long)storage._M_elems + lVar3 + 4);
      *(int *)((long)storage._M_elems + lVar3 + 4) = iVar1;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 4);
  }
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x2c;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x575,"void pop_sorted_suite::pop_alternating()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x2c;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x57d,"void pop_sorted_suite::pop_alternating()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  return;
}

Assistant:

void pop_alternating()
{
    std::array<int, 4> storage = { 11, 22, 33, 44 };
    auto last = storage.end();
    auto first = lower_bound_sorted(storage.begin(), last, 11);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 22, 33, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    first = lower_bound_sorted(storage.begin(), last, 44);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 22, 33, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    first = lower_bound_sorted(storage.begin(), last, 22);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 33, 22, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    first = lower_bound_sorted(storage.begin(), last, 33);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 33, 22, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}